

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void nni_sock_close(nni_sock *s)

{
  int iVar1;
  
  nni_sock_shutdown(s);
  nni_mtx_lock(&sock_lk);
  if (s->s_closed == true) {
    nni_mtx_unlock(&sock_lk);
    nni_sock_rele(s);
    return;
  }
  s->s_closed = true;
  nni_id_remove(&sock_ids,(ulong)s->s_id);
  nni_list_node_remove(&s->s_node);
  do {
    if (s->s_ref < 2) {
      iVar1 = nni_list_empty(&s->s_ctxs);
      if (iVar1 != 0) {
        nni_mtx_unlock(&sock_lk);
        nni_mtx_lock(&s->s_mx);
        iVar1 = nni_list_empty(&s->s_dialers);
        if (iVar1 == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c"
                    ,0x2e5,"nni_list_empty(&s->s_dialers)");
        }
        iVar1 = nni_list_empty(&s->s_listeners);
        if (iVar1 == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c"
                    ,0x2e6,"nni_list_empty(&s->s_listeners)");
        }
        iVar1 = nni_list_empty(&s->s_pipes);
        if (iVar1 == 0) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c"
                    ,0x2e7,"nni_list_empty(&s->s_pipes)");
        }
        nni_mtx_unlock(&s->s_mx);
        sock_destroy(s);
        return;
      }
    }
    nni_cv_wait(&s->s_close_cv);
  } while( true );
}

Assistant:

void
nni_sock_close(nni_sock *s)
{
	// Shutdown everything if not already done.  This operation
	// is idempotent.
	nni_sock_shutdown(s);

	nni_mtx_lock(&sock_lk);
	if (s->s_closed) {
		// Some other thread called close.  All we need to do
		// is drop our reference count.
		nni_mtx_unlock(&sock_lk);
		nni_sock_rele(s);
		return;
	}
	s->s_closed = true;
	nni_id_remove(&sock_ids, s->s_id);

	// We might have been removed from the list already, e.g. by
	// nni_sock_closeall.  This is idempotent.
	nni_list_node_remove(&s->s_node);

	// Wait for all other references to drop.  Note that we
	// have a reference already (from our caller).
	while ((s->s_ref > 1) || (!nni_list_empty(&s->s_ctxs))) {
		nni_cv_wait(&s->s_close_cv);
	}
	nni_mtx_unlock(&sock_lk);

	// Because we already shut everything down before, we should not
	// have any child objects.
	nni_mtx_lock(&s->s_mx);
	NNI_ASSERT(nni_list_empty(&s->s_dialers));
	NNI_ASSERT(nni_list_empty(&s->s_listeners));
	NNI_ASSERT(nni_list_empty(&s->s_pipes));
	nni_mtx_unlock(&s->s_mx);

	sock_destroy(s);
}